

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O0

TimingControl *
slang::ast::DelayControl::fromSyntax
          (Compilation *compilation,DelaySyntax *syntax,ASTContext *context)

{
  Expression *__addr;
  DelaySyntax *this;
  bool bVar1;
  int iVar2;
  ExpressionSyntax *pEVar3;
  undefined4 extraout_var;
  Type *pTVar4;
  Diagnostic *diag;
  SourceRange local_50;
  Compilation *local_40;
  DelayControl *result;
  Expression *local_30;
  Expression *expr;
  ASTContext *context_local;
  DelaySyntax *syntax_local;
  Compilation *compilation_local;
  
  expr = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (DelaySyntax *)compilation;
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->delayValue);
  __addr = expr;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  iVar2 = Expression::bind((int)pEVar3,(sockaddr *)__addr,(socklen_t)result);
  this = syntax_local;
  local_30 = (Expression *)CONCAT44(extraout_var,iVar2);
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_40 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::DelayControl,slang::ast::Expression_const&,slang::SourceRange>
                       ((BumpAllocator *)this,(Expression *)CONCAT44(extraout_var,iVar2),&local_50);
  bVar1 = Expression::bad(local_30);
  if (bVar1) {
    compilation_local =
         (Compilation *)
         TimingControl::badCtrl((Compilation *)syntax_local,(TimingControl *)local_40);
  }
  else {
    pTVar4 = not_null<const_slang::ast::Type_*>::operator->(&local_30->type);
    bVar1 = Type::isNumeric(pTVar4);
    if (bVar1) {
      compilation_local = local_40;
    }
    else {
      diag = ASTContext::addDiag((ASTContext *)expr,(DiagCode)0x100008,local_30->sourceRange);
      pTVar4 = not_null<const_slang::ast::Type_*>::operator*(&local_30->type);
      ast::operator<<(diag,pTVar4);
      compilation_local =
           (Compilation *)
           TimingControl::badCtrl((Compilation *)syntax_local,(TimingControl *)local_40);
    }
  }
  return (TimingControl *)compilation_local;
}

Assistant:

TimingControl& DelayControl::fromSyntax(Compilation& compilation, const DelaySyntax& syntax,
                                        const ASTContext& context) {
    auto& expr = Expression::bind(*syntax.delayValue, context);
    auto result = compilation.emplace<DelayControl>(expr, syntax.sourceRange());
    if (expr.bad())
        return badCtrl(compilation, result);

    if (!expr.type->isNumeric()) {
        context.addDiag(diag::DelayNotNumeric, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }

    return *result;
}